

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O1

void __thiscall fineftp::FtpSession::handleFtpCommandSIZE(FtpSession *this,string *param)

{
  element_type *peVar1;
  long lVar2;
  string local_path;
  stringstream rep;
  ifstream file;
  string local_3e0;
  string local_3c0;
  string local_3a0 [4];
  ios_base local_320 [264];
  string local_218;
  int aiStack_1f8 [122];
  
  peVar1 = (this->logged_in_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Not logged in","");
    sendFtpMessage(this,NOT_LOGGED_IN,&local_218);
  }
  else {
    if ((peVar1->permissions_ & FileRead) != None) {
      toLocalPath(&local_3c0,this,param);
      ::std::ifstream::ifstream
                (&local_218,(string *)&local_3c0,(uint)this->data_type_binary_ * 4 + (_S_in|_S_ate))
      ;
      if (*(int *)((long)aiStack_1f8 + *(long *)(local_218._M_dataplus._M_p + -0x18)) == 0) {
        lVar2 = ::std::istream::tellg();
        if (lVar2 == -1) {
          local_3a0[0]._M_dataplus._M_p = (pointer)&local_3a0[0].field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3a0,"Error getting file size","");
          sendFtpMessage(this,ACTION_ABORTED_LOCAL_ERROR,local_3a0);
          goto LAB_00119250;
        }
        ::std::__cxx11::stringstream::stringstream((stringstream *)local_3a0);
        ::std::ostream::_M_insert<long>((long)&local_3a0[0].field_2);
        ::std::__cxx11::stringbuf::str();
        sendFtpMessage(this,FILE_STATUS,&local_3e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
          operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
        ::std::ios_base::~ios_base(local_320);
      }
      else {
        local_3a0[0]._M_dataplus._M_p = (pointer)&local_3a0[0].field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3a0,"Error opening file for size retrieval","");
        sendFtpMessage(this,ACTION_ABORTED_LOCAL_ERROR,local_3a0);
LAB_00119250:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0[0]._M_dataplus._M_p != &local_3a0[0].field_2) {
          operator_delete(local_3a0[0]._M_dataplus._M_p,
                          local_3a0[0].field_2._M_allocated_capacity + 1);
        }
      }
      ::std::ifstream::~ifstream(&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p == &local_3c0.field_2) {
        return;
      }
      goto LAB_0011931b;
    }
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Permission denied","");
    sendFtpMessage(this,ACTION_NOT_TAKEN,&local_218);
  }
  local_3c0.field_2._M_allocated_capacity = local_218.field_2._M_allocated_capacity;
  local_3c0._M_dataplus._M_p = local_218._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p == &local_218.field_2) {
    return;
  }
LAB_0011931b:
  operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void FtpSession::handleFtpCommandSIZE(const std::string& param)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN, "Not logged in");
      return;
    }
    if (static_cast<int>(logged_in_user_->permissions_ & Permission::FileRead) == 0)
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Permission denied");
      return;
    }

    std::string local_path = toLocalPath(param);

    std::ios::openmode open_mode =
       std::ios::ate | (data_type_binary_ ? (std::ios::in | std::ios::binary) : (std::ios::in));
#if defined(WIN32) && !defined(__GNUG__)
    std::ifstream file(StrConvert::Utf8ToWide(local_path), open_mode);
#else
    std::ifstream file(local_path, open_mode);
#endif

    if (!file.good())
    {
      sendFtpMessage(FtpReplyCode::ACTION_ABORTED_LOCAL_ERROR, "Error opening file for size retrieval");
      return;
    }

    // RFC 3659 actually states that the returned size should depend on the STRU, MODE, and TYPE and that
    // the returned size should be exact. We don't comply with this here. The size returned is the
    // size for TYPE=I.
    auto file_size = file.tellg();
    if (std::fstream::pos_type(-1) == file_size)
    {
      sendFtpMessage(FtpReplyCode::ACTION_ABORTED_LOCAL_ERROR, "Error getting file size");
      return;
    }

    // Form reply string
    std::stringstream rep;
    rep << file_size;

    sendFtpMessage(FtpReplyCode::FILE_STATUS, rep.str());
  }